

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O2

void __thiscall
Assimp::MD5::MD5AnimParser::MD5AnimParser(MD5AnimParser *this,SectionList *mSections)

{
  string *__lhs;
  char cVar1;
  pointer pAVar2;
  pointer pEVar3;
  pointer pBVar4;
  pointer pFVar5;
  MD5AnimParser *pMVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  Logger *pLVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  Element *elem;
  pointer pEVar14;
  Element *elem_2;
  pointer pSVar15;
  char *sz;
  MD5AnimParser *local_480;
  pointer local_478;
  AnimBoneList *local_470;
  FrameList *local_468;
  BaseFrameList *local_460;
  pointer local_458;
  pointer local_450;
  char *sz_1;
  _Vector_base<float,_std::allocator<float>_> a_Stack_440 [43];
  
  local_470 = &this->mAnimatedBones;
  local_460 = &this->mBaseFrames;
  local_468 = &this->mFrames;
  (this->mFrames).
  super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mFrames).
  super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mBaseFrames).
  super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mBaseFrames).
  super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mAnimatedBones).
  super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mBaseFrames).
  super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mAnimatedBones).
  super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mAnimatedBones).
  super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mFrames).
  super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_480 = this;
  pLVar10 = DefaultLogger::get();
  Logger::debug(pLVar10,"MD5AnimParser begin");
  local_480->fFrameRate = 24.0;
  local_480->mNumAnimatedComponents = 0xffffffff;
  local_458 = (mSections->
              super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  pSVar15 = (mSections->
            super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>)._M_impl
            .super__Vector_impl_data._M_start;
  while (pSVar15 != local_458) {
    __lhs = &pSVar15->mName;
    bVar7 = std::operator==(__lhs,"hierarchy");
    local_478 = pSVar15;
    if (bVar7) {
      local_450 = (pSVar15->mElements).
                  super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      for (pEVar14 = (pSVar15->mElements).
                     super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                     ._M_impl.super__Vector_impl_data._M_start; pEVar14 != local_450;
          pEVar14 = pEVar14 + 1) {
        memset((AnimBoneDesc *)&sz_1,0,0x410);
        memset((void *)((long)&sz_1 + 5),0x1b,0x3ff);
        std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
        emplace_back<Assimp::MD5::AnimBoneDesc>(local_470,(AnimBoneDesc *)&sz_1);
        pAVar2 = (local_480->mAnimatedBones).
                 super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pcVar13 = pEVar14->szStart;
        do {
          cVar1 = *pcVar13;
          pcVar13 = pcVar13 + 1;
        } while (cVar1 != '\"');
        uVar12 = 0xffffffffffffffff;
        do {
          uVar11 = uVar12;
          uVar12 = uVar11 + 1;
        } while (pcVar13[uVar11 + 1] != '\"');
        sz_1 = pcVar13 + uVar11 + 2;
        pAVar2[-1].super_BaseJointDescription.mName.length = (ai_uint32)uVar12;
        memcpy(pAVar2[-1].super_BaseJointDescription.mName.data,pcVar13,uVar12 & 0xffffffff);
        *(undefined1 *)((long)pAVar2 + ((uVar12 & 0xffffffff) - 0x40c)) = 0;
        bVar7 = SkipSpaces<char>(&sz_1);
        if (!bVar7) {
          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
        }
        iVar8 = strtol10(sz_1,&sz_1);
        pAVar2[-1].super_BaseJointDescription.mParentIndex = iVar8;
        bVar7 = SkipSpaces<char>(&sz_1);
        if (!bVar7) {
          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
        }
        uVar9 = strtoul10(sz_1,&sz_1);
        pAVar2[-1].iFlags = uVar9;
        if (0x3f < uVar9) {
          MD5Parser::ReportWarning
                    ("Invalid flag combination in hierarchy section",pEVar14->iLineNumber);
        }
        bVar7 = SkipSpaces<char>(&sz_1);
        if (!bVar7) {
          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
        }
        uVar9 = strtoul10(sz_1,&sz_1);
        pAVar2[-1].iFirstKeyIndex = uVar9;
      }
    }
    else {
      bVar7 = std::operator==(__lhs,"baseframe");
      if (bVar7) {
        pEVar3 = (pSVar15->mElements).
                 super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pEVar14 = (pSVar15->mElements).
                       super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                       ._M_impl.super__Vector_impl_data._M_start; pEVar14 != pEVar3;
            pEVar14 = pEVar14 + 1) {
          sz = pEVar14->szStart;
          sz_1 = (char *)0x0;
          a_Stack_440[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          a_Stack_440[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>::
          emplace_back<Assimp::MD5::BaseFrameDesc>(local_460,(BaseFrameDesc *)&sz_1);
          pBVar4 = (local_480->mBaseFrames).
                   super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          bVar7 = SkipSpaces<char>(&sz);
          if (!bVar7) {
            MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
          }
          pcVar13 = sz + 1;
          cVar1 = *sz;
          sz = pcVar13;
          if (cVar1 != '(') {
            MD5Parser::ReportWarning("Unexpected token: ( was expected",pEVar14->iLineNumber);
          }
          bVar7 = SkipSpaces<char>(&sz);
          if (!bVar7) {
            MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
          }
          sz = fast_atoreal_move<float>(sz,(float *)(pBVar4 + -1),true);
          bVar7 = SkipSpaces<char>(&sz);
          if (!bVar7) {
            MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
          }
          sz = fast_atoreal_move<float>(sz,&pBVar4[-1].vPositionXYZ.y,true);
          bVar7 = SkipSpaces<char>(&sz);
          if (!bVar7) {
            MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
          }
          sz = fast_atoreal_move<float>(sz,&pBVar4[-1].vPositionXYZ.z,true);
          bVar7 = SkipSpaces<char>(&sz);
          if (!bVar7) {
            MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
          }
          pcVar13 = sz + 1;
          cVar1 = *sz;
          sz = pcVar13;
          if (cVar1 != ')') {
            MD5Parser::ReportWarning("Unexpected token: ) was expected",pEVar14->iLineNumber);
          }
          bVar7 = SkipSpaces<char>(&sz);
          if (!bVar7) {
            MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
          }
          pcVar13 = sz + 1;
          cVar1 = *sz;
          sz = pcVar13;
          if (cVar1 != '(') {
            MD5Parser::ReportWarning("Unexpected token: ( was expected",pEVar14->iLineNumber);
          }
          bVar7 = SkipSpaces<char>(&sz);
          if (!bVar7) {
            MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
          }
          sz = fast_atoreal_move<float>(sz,&pBVar4[-1].vRotationQuat.x,true);
          bVar7 = SkipSpaces<char>(&sz);
          if (!bVar7) {
            MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
          }
          sz = fast_atoreal_move<float>(sz,&pBVar4[-1].vRotationQuat.y,true);
          bVar7 = SkipSpaces<char>(&sz);
          if (!bVar7) {
            MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
          }
          sz = fast_atoreal_move<float>(sz,&pBVar4[-1].vRotationQuat.z,true);
          bVar7 = SkipSpaces<char>(&sz);
          if (!bVar7) {
            MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
          }
          pcVar13 = sz + 1;
          cVar1 = *sz;
          sz = pcVar13;
          if (cVar1 != ')') {
            MD5Parser::ReportWarning("Unexpected token: ) was expected",pEVar14->iLineNumber);
          }
        }
      }
      else {
        bVar7 = std::operator==(__lhs,"frame");
        if (bVar7) {
          if ((pSVar15->mGlobalValue)._M_string_length == 0) {
            MD5Parser::ReportWarning("A frame section must have a frame index",pSVar15->iLineNumber)
            ;
          }
          else {
            a_Stack_440[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            a_Stack_440[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            sz_1 = (char *)0x0;
            a_Stack_440[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::
            emplace_back<Assimp::MD5::FrameDesc>(local_468,(FrameDesc *)&sz_1);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(a_Stack_440);
            pMVar6 = local_480;
            pFVar5 = (local_480->mFrames).
                     super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar9 = strtoul10((local_478->mGlobalValue)._M_dataplus._M_p,(char **)0x0);
            pFVar5[-1].iIndex = uVar9;
            if ((ulong)pMVar6->mNumAnimatedComponents != 0xffffffff) {
              std::vector<float,_std::allocator<float>_>::reserve
                        (&pFVar5[-1].mValues,(ulong)pMVar6->mNumAnimatedComponents);
            }
            pEVar3 = (local_478->mElements).
                     super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pEVar14 = (local_478->mElements).
                           super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                           ._M_impl.super__Vector_impl_data._M_start; pEVar14 != pEVar3;
                pEVar14 = pEVar14 + 1) {
              sz_1 = pEVar14->szStart;
              while( true ) {
                bVar7 = SkipSpacesAndLineEnd<char>(&sz_1);
                if (!bVar7) break;
                sz_1 = fast_atoreal_move<float>(sz_1,(float *)&sz,true);
                std::vector<float,_std::allocator<float>_>::push_back
                          (&pFVar5[-1].mValues,(value_type_conflict3 *)&sz);
              }
            }
          }
        }
        else {
          bVar7 = std::operator==(__lhs,"numFrames");
          if (bVar7) {
            uVar9 = strtoul10((pSVar15->mGlobalValue)._M_dataplus._M_p,(char **)0x0);
            std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::reserve
                      (local_468,(ulong)uVar9);
          }
          else {
            bVar7 = std::operator==(__lhs,"numJoints");
            if (bVar7) {
              uVar9 = strtoul10((pSVar15->mGlobalValue)._M_dataplus._M_p,(char **)0x0);
              std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
              reserve(local_470,(ulong)uVar9);
              if (local_480->mNumAnimatedComponents == 0xffffffff) {
                local_480->mNumAnimatedComponents = uVar9 * 6;
              }
            }
            else {
              bVar7 = std::operator==(__lhs,"numAnimatedComponents");
              if (bVar7) {
                uVar9 = strtoul10((pSVar15->mGlobalValue)._M_dataplus._M_p,(char **)0x0);
                std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
                reserve(local_470,(ulong)uVar9);
              }
              else {
                bVar7 = std::operator==(__lhs,"frameRate");
                if (bVar7) {
                  fast_atoreal_move<float>
                            ((local_478->mGlobalValue)._M_dataplus._M_p,&local_480->fFrameRate,true)
                  ;
                }
              }
            }
          }
        }
      }
    }
    pSVar15 = local_478 + 1;
  }
  pLVar10 = DefaultLogger::get();
  Logger::debug(pLVar10,"MD5AnimParser end");
  return;
}

Assistant:

MD5AnimParser::MD5AnimParser(SectionList& mSections)
{
    ASSIMP_LOG_DEBUG("MD5AnimParser begin");

    fFrameRate = 24.0f;
    mNumAnimatedComponents = UINT_MAX;
    for (SectionList::const_iterator iter =  mSections.begin(), iterEnd = mSections.end();iter != iterEnd;++iter) {
        if ((*iter).mName == "hierarchy")   {
            // "sheath" 0 63 6
            for (const auto & elem : (*iter).mElements) {
                mAnimatedBones.push_back ( AnimBoneDesc () );
                AnimBoneDesc& desc = mAnimatedBones.back();

                const char* sz = elem.szStart;
                AI_MD5_PARSE_STRING_IN_QUOTATION(desc.mName);
                AI_MD5_SKIP_SPACES();

                // parent index - negative values are allowed (at least -1)
                desc.mParentIndex = ::strtol10(sz,&sz);

                // flags (highest is 2^6-1)
                AI_MD5_SKIP_SPACES();
                if(63 < (desc.iFlags = ::strtoul10(sz,&sz))){
                    MD5Parser::ReportWarning("Invalid flag combination in hierarchy section",elem.iLineNumber);
                }
                AI_MD5_SKIP_SPACES();

                // index of the first animation keyframe component for this joint
                desc.iFirstKeyIndex = ::strtoul10(sz,&sz);
            }
        }
        else if((*iter).mName == "baseframe")   {
            // ( -0.000000 0.016430 -0.006044 ) ( 0.707107 0.000242 0.707107 )
            for (const auto & elem : (*iter).mElements) {
                const char* sz = elem.szStart;

                mBaseFrames.push_back ( BaseFrameDesc () );
                BaseFrameDesc& desc = mBaseFrames.back();

                AI_MD5_READ_TRIPLE(desc.vPositionXYZ);
                AI_MD5_READ_TRIPLE(desc.vRotationQuat);
            }
        }
        else if((*iter).mName ==  "frame")  {
            if (!(*iter).mGlobalValue.length()) {
                MD5Parser::ReportWarning("A frame section must have a frame index",(*iter).iLineNumber);
                continue;
            }

            mFrames.push_back ( FrameDesc () );
            FrameDesc& desc = mFrames.back();
            desc.iIndex = strtoul10((*iter).mGlobalValue.c_str());

            // we do already know how much storage we will presumably need
            if (UINT_MAX != mNumAnimatedComponents) {
                desc.mValues.reserve(mNumAnimatedComponents);
            }

            // now read all elements (continuous list of floats)
            for (const auto & elem : (*iter).mElements){
                const char* sz = elem.szStart;
                while (SkipSpacesAndLineEnd(&sz))   {
                    float f;sz = fast_atoreal_move<float>(sz,f);
                    desc.mValues.push_back(f);
                }
            }
        }
        else if((*iter).mName == "numFrames")   {
            mFrames.reserve(strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if((*iter).mName == "numJoints")   {
            const unsigned int num = strtoul10((*iter).mGlobalValue.c_str());
            mAnimatedBones.reserve(num);

            // try to guess the number of animated components if that element is not given
            if (UINT_MAX  == mNumAnimatedComponents) {
                mNumAnimatedComponents = num * 6;
            }
        }
        else if((*iter).mName == "numAnimatedComponents")   {
            mAnimatedBones.reserve( strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if((*iter).mName == "frameRate")   {
            fast_atoreal_move<float>((*iter).mGlobalValue.c_str(),fFrameRate);
        }
    }
    ASSIMP_LOG_DEBUG("MD5AnimParser end");
}